

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Organya.cpp
# Opt level: O1

void GetORGinfo(int *Wait,uchar *Track,unsigned_short *Freq,long *CurrentMeasure,long *TotalMeasure,
               int *Crotchet,int *Bar,int *StartingLoop)

{
  int iVar1;
  uchar *puVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  
  *Wait = (uint)org_data.info.wait;
  uVar3 = (uint)org_data.info.dot;
  *Crotchet = uVar3;
  uVar5 = (uint)org_data.info.line;
  *Bar = uVar5;
  uVar5 = uVar5 * uVar3;
  *StartingLoop = (int)(org_data.info.repeat_x / (long)(ulong)uVar5);
  *TotalMeasure = org_data.info.end_x / (long)(ulong)uVar5 + -1;
  lVar4 = 0;
  iVar1 = 0;
  if (audio_backend_initialised != false) {
    iVar1 = (int)PlayPos;
  }
  *CurrentMeasure = (long)(iVar1 / (int)uVar5);
  puVar2 = &org_data.info.tdata[0].wave_no;
  do {
    Track[lVar4] = *puVar2;
    Freq[lVar4] = ((TRACKDATA *)(puVar2 + -2))->freq;
    lVar4 = lVar4 + 1;
    puVar2 = puVar2 + 0x18;
  } while (lVar4 != 8);
  return;
}

Assistant:

void GetORGinfo(int*Wait, unsigned char Track[8], unsigned short Freq[8], long*CurrentMeasure, long*TotalMeasure, int*Crotchet, int*Bar, int*StartingLoop) {
	//get wait time, measure total, total steps, tracks, and freqencies
	*Wait = org_data.info.wait;
	*Crotchet = org_data.info.dot;
	*Bar = org_data.info.line;

	int StepsPerMeasure = org_data.info.line * org_data.info.dot;
	*StartingLoop = org_data.info.repeat_x / StepsPerMeasure;
	*TotalMeasure = org_data.info.end_x / StepsPerMeasure -1; //subtract 1 because last measure is never played

	int OrgPos = GetOrganyaPosition();
	*CurrentMeasure = (OrgPos -= (OrgPos % StepsPerMeasure))/StepsPerMeasure;


	//loop for track stuff
	for (int a = 0; a < 8; a++) {
		Track[a] = org_data.info.tdata[a].wave_no;
		Freq[a] = org_data.info.tdata[a].freq;
	}
}